

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O2

void FFSMarshalInstallPreciousMetadata(SstStream Stream,TSMetadataMsg MetaData)

{
  FFSFormatList pFVar1;
  SstData p_Var2;
  TSMetadataMsg p_Var3;
  int iVar4;
  undefined8 uVar5;
  FFSContext p_Var6;
  void *pvVar7;
  void *__dest;
  undefined8 uVar8;
  size_t sVar9;
  char *pcVar10;
  long lVar11;
  char *pcVar12;
  FFSFormatList *ppFVar13;
  undefined8 *puVar14;
  void *local_58;
  TSMetadataMsg local_50;
  int Type;
  long local_40;
  int ElementSize;
  
  if (Stream->ReaderFFSContext == (FFSContext)0x0) {
    uVar5 = create_local_FMcontext();
    p_Var6 = (FFSContext)create_FFSContext_FM(uVar5);
    Stream->ReaderFFSContext = p_Var6;
    free_FMcontext(uVar5);
  }
  ppFVar13 = &MetaData->Formats;
  while (pFVar1 = *ppFVar13, pFVar1 != (FFSFormatList)0x0) {
    sVar9 = pFVar1->FormatIDRepLen;
    pvVar7 = malloc(sVar9);
    __dest = malloc(pFVar1->FormatServerRepLen);
    memcpy(pvVar7,pFVar1->FormatIDRep,sVar9);
    memcpy(__dest,pFVar1->FormatServerRep,pFVar1->FormatServerRepLen);
    uVar5 = FMContext_from_FFS(Stream->ReaderFFSContext);
    load_external_format_FMcontext(uVar5,pvVar7,(int)pFVar1->FormatIDRepLen);
    free(pvVar7);
    ppFVar13 = &pFVar1->Next;
  }
  local_50 = MetaData;
  (*Stream->AttrSetupUpcall)(Stream->SetupUpcallReader,(char *)0x0,0,(void *)0x0);
  lVar11 = 0;
  while( true ) {
    if (Stream->WriterCohortSize <= lVar11) {
      return;
    }
    if (local_50->AttributeData[lVar11].DataSize == 0) break;
    local_40 = lVar11;
    uVar5 = FFSTypeHandle_from_encode
                      (Stream->ReaderFFSContext,local_50->AttributeData[lVar11].block);
    iVar4 = FFShas_conversion(uVar5);
    if (iVar4 == 0) {
      uVar8 = FMContext_from_FFS(Stream->ReaderFFSContext);
      uVar8 = FMformat_from_ID(uVar8,local_50->AttributeData[lVar11].block);
      uVar8 = format_list_of_FMFormat(uVar8);
      uVar8 = FMcopy_struct_list(uVar8);
      FMlocalize_structs(uVar8);
      establish_conversion(Stream->ReaderFFSContext,uVar5,uVar8);
      FMfree_struct_list(uVar8);
    }
    iVar4 = FFSdecode_in_place_possible(uVar5);
    p_Var3 = local_50;
    p_Var2 = local_50->AttributeData;
    if (iVar4 == 0) {
      sVar9 = FFS_est_decode_length
                        (Stream->ReaderFFSContext,p_Var2[lVar11].block,p_Var2[lVar11].DataSize);
      local_58 = malloc(sVar9);
      uVar8 = create_fixed_FFSBuffer(local_58,sVar9);
      FFSdecode_to_buffer(Stream->ReaderFFSContext,p_Var3->AttributeData[lVar11].block,uVar8);
    }
    else {
      FFSdecode_in_place(Stream->ReaderFFSContext,p_Var2[lVar11].block,&local_58);
    }
    if (LoadAttributes_DumpMetadata == 0xffffffff) {
      pcVar10 = getenv("SstDumpMetadata");
      LoadAttributes_DumpMetadata = (uint)(pcVar10 != (char *)0x0);
    }
    if ((LoadAttributes_DumpMetadata != 0) && (Stream->Rank == 0)) {
      printf("\nIncomingAttributeDatablock from WriterRank %d is %p :\n",local_40,local_58);
      uVar8 = FMFormat_of_original(uVar5);
      FMdump_data(uVar8,local_58,0xfa000);
      puts("\n");
    }
    uVar5 = FMFormat_of_original(uVar5);
    lVar11 = format_list_of_FMFormat(uVar5);
    for (puVar14 = *(undefined8 **)(lVar11 + 8); pcVar10 = (char *)*puVar14, pcVar10 != (char *)0x0;
        puVar14 = puVar14 + 3) {
      pvVar7 = (void *)((long)*(int *)((long)puVar14 + 0x14) + (long)local_58);
      pcVar12 = strchr(pcVar10,0x5f);
      pcVar12 = strchr(pcVar12 + 1,0x5f);
      __isoc99_sscanf(pcVar10,"SST%d_%d_",&ElementSize,&Type);
      iVar4 = Type;
      pcVar10 = strdup(pcVar12 + 1);
      (*Stream->AttrSetupUpcall)(Stream->SetupUpcallReader,pcVar10,iVar4,pvVar7);
      free(pcVar10);
    }
    lVar11 = local_40 + 1;
  }
  return;
}

Assistant:

extern void FFSMarshalInstallPreciousMetadata(SstStream Stream, TSMetadataMsg MetaData)
{
    if (!Stream->ReaderFFSContext)
    {
        FMContext Tmp = create_local_FMcontext();
        Stream->ReaderFFSContext = create_FFSContext_FM(Tmp);
        free_FMcontext(Tmp);
    }

    LoadFormats(Stream, MetaData->Formats);

    LoadAttributes(Stream, MetaData);
}